

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

void __thiscall MapLoader::MapLoader(MapLoader *this,MapLoader *toCopy)

{
  string *this_00;
  MapLoader *toCopy_local;
  MapLoader *this_local;
  
  this->_vptr_MapLoader = (_func_int **)&PTR__MapLoader_00169a70;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  this->pMapFile = this_00;
  std::__cxx11::string::operator=((string *)this->pMapFile,(string *)toCopy->pMapFile);
  return;
}

Assistant:

MapLoader::MapLoader(const MapLoader &toCopy) {
    pMapFile = new std::string();
    *pMapFile = *toCopy.pMapFile;
}